

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effective_info.c
# Opt level: O0

double sum_row(double *row,size_t n)

{
  ulong local_30;
  size_t i;
  double sum;
  size_t n_local;
  double *row_local;
  
  i = 0;
  local_30 = 0;
  while( true ) {
    if (n <= local_30) {
      return (double)i;
    }
    if (row[local_30] <= 0.0 && row[local_30] != 0.0) break;
    i = (size_t)(row[local_30] + (double)i);
    local_30 = local_30 + 1;
  }
  return NAN;
}

Assistant:

static inline double sum_row(double const *row, size_t n)
{
    double sum = 0.0;
    for (size_t i = 0; i < n; ++i)
    {
        if (row[i] < 0.0)
            return NAN;
        sum += row[i];
    }
    return sum;
}